

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRuleMatcher>::emplace<QMimeMagicRuleMatcher_const&>
          (QMovableArrayOps<QMimeMagicRuleMatcher> *this,qsizetype i,QMimeMagicRuleMatcher *args)

{
  qsizetype *pqVar1;
  QMimeMagicRuleMatcher **ppQVar2;
  QMimeMagicRuleMatcher *pQVar3;
  Data *pDVar4;
  long lVar5;
  QMimeMagicRuleMatcher *pQVar6;
  Data *pDVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QMimeMagicRuleMatcher tmp;
  QArrayDataPointer<QMimeMagicRule> local_68;
  uint uStack_50;
  undefined4 uStack_4c;
  Data *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
           super_QArrayDataPointer<QMimeMagicRuleMatcher>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004c1fbe:
    local_68.d = (args->m_list).d.d;
    local_68.ptr = (args->m_list).d.ptr;
    local_68.size = (args->m_list).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _uStack_50 = CONCAT44(0xaaaaaaaa,args->m_priority);
    local_48 = (args->m_mimetype).d.d;
    pcStack_40 = (args->m_mimetype).d.ptr;
    local_38 = (args->m_mimetype).d.size;
    if (local_48 != (Data *)0x0) {
      LOCK();
      (local_48->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (local_48->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar9 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
            super_QArrayDataPointer<QMimeMagicRuleMatcher>.size != 0;
    QArrayDataPointer<QMimeMagicRuleMatcher>::detachAndGrow
              ((QArrayDataPointer<QMimeMagicRuleMatcher> *)this,(uint)(i == 0 && bVar9),1,
               (QMimeMagicRuleMatcher **)0x0,(QArrayDataPointer<QMimeMagicRuleMatcher> *)0x0);
    pQVar6 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
             super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
    if (i == 0 && bVar9) {
      pQVar6[-1].m_list.d.d = local_68.d;
      pQVar6[-1].m_list.d.ptr = local_68.ptr;
      pQVar6[-1].m_list.d.size = local_68.size;
      pQVar6[-1].m_priority = uStack_50;
      pQVar6[-1].m_mimetype.d.d = local_48;
      pQVar6[-1].m_mimetype.d.ptr = pcStack_40;
      pQVar6[-1].m_mimetype.d.size = local_38;
      (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
      super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr = pQVar6 + -1;
    }
    else {
      pQVar3 = pQVar6 + i;
      memmove(pQVar3 + 1,pQVar6 + i,
              ((this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
               super_QArrayDataPointer<QMimeMagicRuleMatcher>.size - i) * 0x38);
      (pQVar3->m_list).d.d = local_68.d;
      (pQVar3->m_list).d.ptr = local_68.ptr;
      (pQVar3->m_list).d.size = local_68.size;
      pQVar3->m_priority = uStack_50;
      (pQVar3->m_mimetype).d.d = local_48;
      (pQVar3->m_mimetype).d.ptr = pcStack_40;
      (pQVar3->m_mimetype).d.size = local_38;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
              super_QArrayDataPointer<QMimeMagicRuleMatcher>.size;
    *pqVar1 = *pqVar1 + 1;
    local_38 = 0;
    pcStack_40 = (char16_t *)0x0;
    local_48 = (Data *)0x0;
    local_68.size = 0;
    local_68.ptr = (QMimeMagicRule *)0x0;
    local_68.d = (Data *)0x0;
    QArrayDataPointer<QMimeMagicRule>::~QArrayDataPointer(&local_68);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
            super_QArrayDataPointer<QMimeMagicRuleMatcher>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                      super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x6db6db6db6db6db7)) {
      pQVar6 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
               super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
      pDVar7 = (args->m_list).d.d;
      pQVar6[lVar5].m_list.d.d = pDVar7;
      pQVar6[lVar5].m_list.d.ptr = (args->m_list).d.ptr;
      pQVar6[lVar5].m_list.d.size = (args->m_list).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar6[lVar5].m_priority = args->m_priority;
      pDVar8 = (args->m_mimetype).d.d;
      pQVar6[lVar5].m_mimetype.d.d = pDVar8;
      pQVar6[lVar5].m_mimetype.d.ptr = (args->m_mimetype).d.ptr;
      pQVar6[lVar5].m_mimetype.d.size = (args->m_mimetype).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((QMimeMagicRuleMatcher *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
          super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr)) goto LAB_004c1fbe;
      pQVar6 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
               super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
      pDVar7 = (args->m_list).d.d;
      pQVar6[-1].m_list.d.d = pDVar7;
      pQVar6[-1].m_list.d.ptr = (args->m_list).d.ptr;
      pQVar6[-1].m_list.d.size = (args->m_list).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar6[-1].m_priority = args->m_priority;
      pDVar8 = (args->m_mimetype).d.d;
      pQVar6[-1].m_mimetype.d.d = pDVar8;
      pQVar6[-1].m_mimetype.d.ptr = (args->m_mimetype).d.ptr;
      pQVar6[-1].m_mimetype.d.size = (args->m_mimetype).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar2 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                 super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
              super_QArrayDataPointer<QMimeMagicRuleMatcher>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }